

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O0

void ra_append_move_range
               (roaring_array_t *ra,roaring_array_t *sa,int32_t start_index,int32_t end_index)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  int *in_RDI;
  int32_t pos;
  int32_t i;
  int32_t in_stack_ffffffffffffffe4;
  
  extend_array((roaring_array_t *)CONCAT44(in_EDX,in_ECX),in_stack_ffffffffffffffe4);
  for (; in_EDX < in_ECX; in_EDX = in_EDX + 1) {
    iVar1 = *in_RDI;
    *(undefined2 *)(*(long *)(in_RDI + 4) + (long)iVar1 * 2) =
         *(undefined2 *)(*(long *)(in_RSI + 0x10) + (long)in_EDX * 2);
    *(undefined8 *)(*(long *)(in_RDI + 2) + (long)iVar1 * 8) =
         *(undefined8 *)(*(long *)(in_RSI + 8) + (long)in_EDX * 8);
    *(undefined1 *)(*(long *)(in_RDI + 6) + (long)iVar1) =
         *(undefined1 *)(*(long *)(in_RSI + 0x18) + (long)in_EDX);
    *in_RDI = *in_RDI + 1;
  }
  return;
}

Assistant:

void ra_append_move_range(roaring_array_t *ra, roaring_array_t *sa,
                          int32_t start_index, int32_t end_index) {
    extend_array(ra, end_index - start_index);

    for (int32_t i = start_index; i < end_index; ++i) {
        const int32_t pos = ra->size;

        ra->keys[pos] = sa->keys[i];
        ra->containers[pos] = sa->containers[i];
        ra->typecodes[pos] = sa->typecodes[i];
        ra->size++;
    }
}